

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Skeleton_blocker_complex.h
# Opt level: O2

optional<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_> * __thiscall
Gudhi::skeleton_blocker::
Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>::operator[]
          (optional<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>
           *__return_storage_ptr__,
          Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits> *this,
          pair<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
          *ab)

{
  adj_list_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::setS,_boost::vecS,_boost::undirectedS,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_vertex,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,_boost::no_property,_boost::listS>,_boost::vecS,_boost::setS,_boost::undirectedS,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_vertex,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,_boost::no_property,_boost::listS>::config,_boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::setS,_boost::vecS,_boost::undirectedS,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_vertex,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,_boost::no_property,_boost::listS>,_boost::vecS,_boost::setS,_boost::undirectedS,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_vertex,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,_boost::no_property,_boost::listS>::config>_>
  *in_R8;
  pair<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_bool> edge_pair;
  pair<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_bool> local_30;
  
  (__return_storage_ptr__->super_type).m_initialized = false;
  boost::
  edge<boost::detail::adj_list_gen<boost::adjacency_list<boost::setS,boost::vecS,boost::undirectedS,Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_vertex,Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,boost::no_property,boost::listS>,boost::vecS,boost::setS,boost::undirectedS,Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_vertex,Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,boost::no_property,boost::listS>::config,boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::setS,boost::vecS,boost::undirectedS,Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_vertex,Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,boost::no_property,boost::listS>,boost::vecS,boost::setS,boost::undirectedS,Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_vertex,Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,boost::no_property,boost::listS>::config>>
            (&local_30,(boost *)(long)(ab->first).vertex,(long)(ab->second).vertex,
             (vertex_descriptor)&this->skeleton,in_R8);
  if (local_30.second == true) {
    *(property_type **)((long)&(__return_storage_ptr__->super_type).m_storage.dummy_ + 0x10) =
         local_30.first.m_eproperty;
    (__return_storage_ptr__->super_type).m_storage.dummy_.aligner_ =
         (type)local_30.first.super_edge_base<boost::undirected_tag,_unsigned_long>.m_source;
    *(unsigned_long *)((long)&(__return_storage_ptr__->super_type).m_storage.dummy_ + 8) =
         local_30.first.super_edge_base<boost::undirected_tag,_unsigned_long>.m_target;
    (__return_storage_ptr__->super_type).m_initialized = true;
  }
  return __return_storage_ptr__;
}

Assistant:

boost::optional<Edge_handle> operator[](
                                          const std::pair<Vertex_handle, Vertex_handle>& ab) const {
    boost::optional<Edge_handle> res;
    std::pair<Edge_handle, bool> edge_pair(
                                           boost::edge(ab.first.vertex, ab.second.vertex, skeleton));
    if (edge_pair.second)
      res = edge_pair.first;
    return res;
  }